

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

Vec_Ptr_t * Ssw_SmlSimDataPointers(Ssw_Sml_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **__s;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  
  p_00 = p->pAig->vObjs;
  iVar6 = p_00->nSize;
  lVar4 = (long)iVar6;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar6 - 1U) {
    iVar1 = iVar6;
  }
  pVVar2->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar1 << 3);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar6;
  lVar5 = 0;
  memset(__s,0,lVar4 * 8);
  do {
    if (iVar6 <= lVar5) {
      return pVVar2;
    }
    pvVar3 = Vec_PtrEntry(p_00,(int)lVar5);
    if (pvVar3 != (void *)0x0) {
      if (lVar4 <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      __s[lVar5] = (void *)((long)&p[1].pAig + (long)(int)lVar5 * (long)p->nWordsTotal * 4);
    }
    lVar5 = lVar5 + 1;
    p_00 = p->pAig->vObjs;
    iVar6 = p_00->nSize;
  } while( true );
}

Assistant:

Vec_Ptr_t * Ssw_SmlSimDataPointers( Ssw_Sml_t * p )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i;
    vSimInfo = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
        Vec_PtrWriteEntry( vSimInfo, i, Ssw_ObjSim(p, i) );
    return vSimInfo;
}